

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O3

vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> * __thiscall
QPDFOutlineDocumentHelper::getOutlinesForPage
          (vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
           *__return_storage_ptr__,QPDFOutlineDocumentHelper *this,QPDFObjGen og)

{
  const_iterator cVar1;
  mapped_type *__x;
  element_type *peVar2;
  QPDFObjGen local_20;
  
  peVar2 = (this->m).
           super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_20 = og;
  if ((peVar2->by_page)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    initializeByPage(this);
    peVar2 = (this->m).
             super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  (__return_storage_ptr__->
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
          ::find(&(peVar2->by_page)._M_t,&local_20);
  if ((_Rb_tree_header *)cVar1._M_node != &(peVar2->by_page)._M_t._M_impl.super__Rb_tree_header) {
    __x = std::
          map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
          ::operator[](&((this->m).
                         super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->by_page,&local_20);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::operator=
              (__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFOutlineObjectHelper>
QPDFOutlineDocumentHelper::getOutlinesForPage(QPDFObjGen og)
{
    if (m->by_page.empty()) {
        initializeByPage();
    }
    std::vector<QPDFOutlineObjectHelper> result;
    if (m->by_page.count(og)) {
        result = m->by_page[og];
    }
    return result;
}